

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O0

void am_generic_renew_copied_comp(Am_Object *object)

{
  undefined1 auVar1 [16];
  Am_Object_Data *pAVar2;
  Am_Object AVar3;
  bool bVar4;
  unsigned_short uVar5;
  Am_Slot_Key AVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  Am_Object_Data *this;
  Am_Object_Data *local_e8;
  int local_a4;
  int current_rank;
  Am_Object current_component;
  int local_8c;
  int i;
  Am_Object part;
  Am_Object *part_map;
  Am_Value_List local_70;
  uint local_5c;
  int parts_length;
  undefined1 local_50 [8];
  Am_Part_Iterator parts;
  Am_Value_List new_components;
  undefined1 local_20 [8];
  Am_Value_List components;
  Am_Object *object_local;
  
  components.item = (Am_List_Item *)object;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar7 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar7);
  Am_Value_List::Am_Value_List((Am_Value_List *)&parts.owner);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa8,object);
  Am_Part_Iterator::Am_Part_Iterator
            ((Am_Part_Iterator *)local_50,(Am_Object *)&stack0xffffffffffffffa8);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
  uVar5 = Am_Part_Iterator::Length((Am_Part_Iterator *)local_50);
  local_5c = (uint)uVar5;
  bVar4 = Am_Value_List::Empty((Am_Value_List *)local_20);
  if ((bVar4) || (local_5c == 0)) {
    Am_Value_List::Am_Value_List(&local_70);
    pAVar8 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
    Am_Object::Set(object,0x82,pAVar8,0);
    Am_Value_List::~Am_Value_List(&local_70);
  }
  else {
    uVar9 = (ulong)(int)(local_5c * 2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar9;
    uVar10 = SUB168(auVar1 * ZEXT816(8),0);
    uVar12 = uVar10 + 8;
    if (0xfffffffffffffff7 < uVar10) {
      uVar12 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar11 = (ulong *)operator_new__(uVar12);
    *puVar11 = uVar9;
    part.data = (Am_Object_Data *)(puVar11 + 1);
    if (uVar9 != 0) {
      local_e8 = part.data;
      do {
        Am_Object::Am_Object((Am_Object *)local_e8);
        local_e8 = (Am_Object_Data *)&(local_e8->super_Am_Wrapper).refs;
      } while (local_e8 !=
               (Am_Object_Data *)(&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + uVar9)
              );
    }
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff78);
    local_8c = 0;
    Am_Part_Iterator::Start((Am_Part_Iterator *)local_50);
    while (bVar4 = Am_Part_Iterator::Last((Am_Part_Iterator *)local_50), ((bVar4 ^ 0xffU) & 1) != 0)
    {
      Am_Part_Iterator::Get((Am_Part_Iterator *)&current_component);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffff78,&current_component);
      Am_Object::~Am_Object(&current_component);
      Am_Object::operator=
                ((Am_Object *)
                 (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
                 (int)(local_8c + local_5c)),(Am_Object *)&stack0xffffffffffffff78);
      pAVar7 = Am_Object::Get((Am_Object *)&stack0xffffffffffffff78,0xc,0);
      Am_Object::operator=
                ((Am_Object *)(&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + local_8c)
                 ,pAVar7);
      local_8c = local_8c + 1;
      Am_Part_Iterator::Next((Am_Part_Iterator *)local_50);
    }
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff60);
    local_a4 = 0;
    Am_Value_List::Start((Am_Value_List *)local_20);
    while (bVar4 = Am_Value_List::Last((Am_Value_List *)local_20), AVar3 = part,
          ((bVar4 ^ 0xffU) & 1) != 0) {
      pAVar7 = Am_Value_List::Get((Am_Value_List *)local_20);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffff60,pAVar7);
      AVar6 = Am_Object::Get_Key((Am_Object *)&stack0xffffffffffffff60);
      if (AVar6 != 2) {
        for (local_8c = 0; local_8c < (int)local_5c; local_8c = local_8c + 1) {
          bVar4 = Am_Object::operator==
                            ((Am_Object *)&stack0xffffffffffffff60,
                             (Am_Object *)
                             (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type + local_8c))
          ;
          if (bVar4) {
            Am_Object::Set((Am_Object *)
                           (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
                           (int)(local_8c + local_5c)),0x85,local_a4,0);
            pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_
                               ((Am_Object *)
                                (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
                                (int)(local_8c + local_5c)));
            Am_Value_List::Add((Am_Value_List *)&parts.owner,pAVar8,Am_TAIL,true);
            local_a4 = local_a4 + 1;
            break;
          }
        }
      }
      Am_Value_List::Next((Am_Value_List *)local_20);
    }
    if (part.data != (Am_Object_Data *)0x0) {
      pAVar2 = part.data + -1;
      this = (Am_Object_Data *)
             (&((part.data)->super_Am_Wrapper).super_Am_Registered_Type +
             *(long *)&part.data[-1].data.data_size);
      while (AVar3.data != this) {
        this = (Am_Object_Data *)&this[-1].data.data_size;
        Am_Object::~Am_Object((Am_Object *)this);
      }
      operator_delete__(&(pAVar2->data).data_size);
    }
    pAVar8 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&parts.owner);
    Am_Object::Set(object,0x82,pAVar8,0);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff60);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff78);
  }
  Am_Part_Iterator::~Am_Part_Iterator((Am_Part_Iterator *)local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&parts.owner);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

void
am_generic_renew_copied_comp(Am_Object object)
{
  Am_Value_List components;
  components = object.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = object;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    object.Set(Am_GRAPHICAL_PARTS, Am_Value_List());
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  int current_rank = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    if (current_component.Get_Key() == Am_NO_INHERIT)
      continue;
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        part_map[i + parts_length].Set(Am_RANK, current_rank);
        new_components.Add(part_map[i + parts_length]);
        ++current_rank;
        break;
      }
  }
  delete[] part_map;
  object.Set(Am_GRAPHICAL_PARTS, new_components);
}